

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_GetValueOut_Test::TestBody(AbstractTransaction_GetValueOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  Txid txid;
  undefined1 local_120 [32];
  string hex;
  AssertionResult gtest_ar_4;
  AssertHelper local_b8;
  ByteData256 bytedata;
  Amount local_90;
  ByteData bytedata2;
  Transaction tx;
  ScriptWitness local_28;
  
  cfd::core::Transaction::Transaction(&tx,2,3);
  std::__cxx11::string::string
            ((string *)local_120,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             (allocator *)&bytedata2);
  cfd::core::Txid::Txid(&txid,(string *)local_120);
  std::__cxx11::string::string
            ((string *)&bytedata,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",
             (allocator *)&local_90);
  cfd::core::Script::Script((Script *)&hex,(string *)&bytedata);
  cfd::core::Transaction::AddTxIn(&tx,&txid,0,0xffffffff,(Script *)&hex);
  cfd::core::Script::~Script((Script *)&hex);
  std::__cxx11::string::~string((string *)&bytedata);
  cfd::core::Txid::~Txid(&txid);
  std::__cxx11::string::~string((string *)local_120);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(10000);
  local_120._0_8_ = AVar3.amount_;
  local_120[8] = AVar3.ignore_check_;
  std::__cxx11::string::string
            ((string *)&txid,"0014913e0b9281dab16f502101ad4e655074396f34c5",(allocator *)&bytedata);
  cfd::core::Script::Script((Script *)&hex,(string *)&txid);
  cfd::core::Transaction::AddTxOut(&tx,(Amount *)local_120,(Script *)&hex);
  cfd::core::Script::~Script((Script *)&hex);
  std::__cxx11::string::~string((string *)&txid);
  cfd::core::Amount::Amount(&local_90);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      AVar3 = cfd::core::AbstractTransaction::GetValueOut(&tx.super_AbstractTransaction);
      local_90.amount_ = AVar3.amount_;
      local_90.ignore_check_ = AVar3.ignore_check_;
    }
  }
  else {
    testing::Message::Message((Message *)&hex);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&txid,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x109,
               "Expected: amount = tx.GetValueOut() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&hex);
  }
  txid._vptr_Txid = (_func_int **)cfd::core::Amount::GetSatoshiValue(&local_90);
  local_120._0_4_ = 10000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&hex,"amount.GetSatoshiValue()","10000",(long *)&txid,(int *)local_120);
  if ((char)hex._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&txid);
    if (hex._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)hex._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)&txid);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txid);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&hex._M_string_length);
  cfd::core::ByteData256::ByteData256(&bytedata);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetHash((ByteData256 *)&hex,&tx.super_AbstractTransaction);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&bytedata.data_,&hex);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hex);
    }
  }
  else {
    testing::Message::Message((Message *)&hex);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&txid,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x10e,
               "Expected: bytedata = tx.GetHash() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&hex);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_(&hex,&bytedata);
  testing::internal::CmpHelperSTREQ
            ((internal *)&txid,"bytedata.GetHex().c_str()",
             "\"94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f\"",
             hex._M_dataplus._M_p,"94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f"
            );
  std::__cxx11::string::~string((string *)&hex);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&hex);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x111,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)&hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&hex);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  std::__cxx11::string::string
            ((string *)&hex,"02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763",
             (allocator *)&txid);
  cfd::core::ByteData::ByteData(&bytedata2,&hex);
  std::__cxx11::string::~string((string *)&hex);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::AddScriptWitnessStack(&local_28,&tx,0,&bytedata2);
      cfd::core::ScriptWitness::~ScriptWitness(&local_28);
    }
  }
  else {
    testing::Message::Message((Message *)&hex);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&txid,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x116,
               "Expected: tx.AddScriptWitnessStack(0, bytedata2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&hex);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetWitnessHash
                ((ByteData256 *)&hex,&tx.super_AbstractTransaction);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&bytedata.data_,&hex);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hex);
    }
  }
  else {
    testing::Message::Message((Message *)&hex);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&txid,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x117,
               "Expected: bytedata = tx.GetWitnessHash() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&hex);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_(&hex,&bytedata);
  testing::internal::CmpHelperSTREQ
            ((internal *)&txid,"bytedata.GetHex().c_str()",
             "\"0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416\"",
             hex._M_dataplus._M_p,"0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416"
            );
  std::__cxx11::string::~string((string *)&hex);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&hex);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)&hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&hex);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  hex._M_dataplus._M_p = (pointer)&hex.field_2;
  hex._M_string_length = 0;
  hex.field_2._M_local_buf[0] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&txid,&tx.super_AbstractTransaction);
      std::__cxx11::string::operator=((string *)&hex,(string *)&txid);
      std::__cxx11::string::~string((string *)&txid);
    }
  }
  else {
    testing::Message::Message((Message *)&txid);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x11e,
               "Expected: hex = tx.GetHex() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)&txid);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txid);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&txid,"hex.c_str()",
             "\"02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000\""
             ,hex._M_dataplus._M_p,
             "02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000"
            );
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)local_120);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  cfd::core::Txid::Txid(&txid);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetTxid((Txid *)local_120,&tx.super_AbstractTransaction);
      cfd::core::Txid::operator=(&txid,(Txid *)local_120);
      cfd::core::Txid::~Txid((Txid *)local_120);
    }
  }
  else {
    testing::Message::Message((Message *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x125,
               "Expected: txid = tx.GetTxid() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_120);
  }
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_120,&txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"txid.GetHex().c_str()",
             "\"0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094\"",
             (char *)local_120._0_8_,
             "0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094");
  std::__cxx11::string::~string((string *)local_120);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)local_120);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::Txid::~Txid(&txid);
  std::__cxx11::string::~string((string *)&hex);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata);
  cfd::core::Transaction::~Transaction(&tx);
  return;
}

Assistant:

TEST(AbstractTransaction, GetValueOut) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));
  tx.AddTxOut(Amount::CreateBySatoshiAmount(10000),
              Script("0014913e0b9281dab16f502101ad4e655074396f34c5"));
  Amount amount;
  // GetValueOut
  EXPECT_NO_THROW(amount = tx.GetValueOut());
  EXPECT_EQ(amount.GetSatoshiValue(), 10000);

  // GetHash(bool)
  ByteData256 bytedata;
  EXPECT_NO_THROW(bytedata = tx.GetHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f");

  // GetWitnessHash
  ByteData bytedata2(
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, bytedata2));
  EXPECT_NO_THROW(bytedata = tx.GetWitnessHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416");

  // GetHex
  std::string hex;
  EXPECT_NO_THROW(hex = tx.GetHex());
  EXPECT_STREQ(
      hex.c_str(),
      "02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000");

  // GetTxid
  Txid txid;
  EXPECT_NO_THROW(txid = tx.GetTxid());
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094");
}